

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

ssw_file_t ssw_open_and_procrec0(char *filename)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong *puVar4;
  FILE *pFVar5;
  undefined8 *puVar6;
  void *__ptr;
  char *__s2;
  undefined8 in_RDI;
  char *expected_kods;
  char *bn;
  char *tmp;
  uint n_2;
  char *r_2;
  uint n_1;
  char *r_1;
  uint n;
  char *r;
  uint64_t lenrec0_b;
  int missingrec0;
  uint mcnp6_lenaids;
  uint rec0begin;
  uint64_t lenrec0;
  uint64_t first64;
  uint32_t first32;
  char *buf;
  ssw_fileinternal_t *f;
  ssw_file_t out;
  int *dest;
  ssw_fileinternal_t *in_stack_ffffffffffffff50;
  ulong local_68;
  uint local_58;
  uint local_54;
  ulong local_50;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  int *local_18;
  undefined8 local_10;
  int *local_8;
  
  local_10 = in_RDI;
  local_18 = (int *)calloc(1,0x1a0);
  if (local_18 == (int *)0x0) {
    ssw_error((char *)0x1029ed);
  }
  local_18[0x3e] = 0;
  local_18[0x3f] = 0;
  local_8 = local_18;
  dest = local_18;
  mcpl_generic_fopen(&local_30,local_10);
  *(undefined8 *)(dest + 0x3e) = local_30;
  *(undefined8 *)(dest + 0x40) = local_28;
  *(undefined8 *)(dest + 0x42) = local_20;
  local_18[0x5e] = 0x400;
  local_18[0x5f] = 0;
  puVar4 = (ulong *)malloc(*(size_t *)(local_18 + 0x5e));
  if (puVar4 == (ulong *)0x0) {
    ssw_error((char *)0x102aa8);
  }
  *(ulong **)(local_18 + 0x60) = puVar4;
  ssw_readbytes(in_stack_ffffffffffffff50,(char *)dest,0x102ad9);
  uVar1 = (uint)*puVar4;
  uVar2 = *puVar4;
  *local_18 = 0;
  local_18[0x3d] = 0;
  local_50 = 99999;
  local_54 = 0;
  local_58 = 0x50;
  if ((((uVar1 == 8) && (*(uint *)((long)puVar4 + 0xc) == 8)) &&
      (((uint)puVar4[2] == 0x8f || ((uint)puVar4[2] == 0xbf)))) &&
     (('\x1f' < *(char *)((long)puVar4 + 0x14) && (*(char *)((long)puVar4 + 0x14) < '\x7f')))) {
    local_18[0x3d] = 1;
    *local_18 = 4;
    local_50 = (ulong)(uint)puVar4[2];
    local_54 = 0x14;
    if ((uint)puVar4[2] == 0xbf) {
      local_58 = 0x80;
    }
  }
  else if ((uVar1 == 8) &&
          (((puVar4[2] == 8 &&
            (((puVar4[3] == 0x8f || (puVar4[3] == 0xbf)) && ('\x1f' < (char)puVar4[4])))) &&
           ((char)puVar4[4] < '\x7f')))) {
    local_18[0x3d] = 1;
    *local_18 = 8;
    local_50 = puVar4[3];
    local_54 = 0x20;
    if (puVar4[3] == 0xbf) {
      local_58 = 0x80;
    }
  }
  if (local_18[0x3d] == 0) {
    if (((uVar1 == 0xa3) || (uVar1 == 0xa7)) &&
       (('\x1f' < *(char *)((long)puVar4 + 4) && (*(char *)((long)puVar4 + 4) < '\x7f')))) {
      local_18[0x3d] = 2;
      *local_18 = 4;
      local_54 = 4;
      local_50 = (ulong)uVar1;
    }
    else if (((uVar2 == 0xa3) || (uVar2 == 0xa7)) &&
            (('\x1f' < (char)puVar4[1] && ((char)puVar4[1] < '\x7f')))) {
      local_18[0x3d] = 2;
      *local_18 = 8;
      local_54 = 8;
      local_50 = uVar2;
    }
  }
  if (local_18[0x3d] == 0) {
    if (((uVar1 == 0x8f) && ('\x1f' < *(char *)((long)puVar4 + 4))) &&
       (*(char *)((long)puVar4 + 4) < '\x7f')) {
      local_18[0x3d] = 3;
      *local_18 = 4;
      local_54 = 4;
      local_50 = 0x8f;
    }
    else if (((uVar2 == 0x8f) && ('\x1f' < (char)puVar4[1])) && ((char)puVar4[1] < '\x7f')) {
      local_18[0x3d] = 3;
      *local_18 = 8;
      local_54 = 8;
      local_50 = uVar2;
    }
  }
  if (local_18[0x3d] == 0) {
    ssw_openerror(in_stack_ffffffffffffff50,(char *)dest);
  }
  if (*local_18 == 8) {
    pFVar5 = (FILE *)ssw_stdout();
    fprintf(pFVar5,
            "ssw_open_file WARNING: 64bit Fortran records detected which is untested (feedback appreciated at https://mctools.github.io/mcpl/contact/).\n"
           );
  }
  ssw_readbytes(in_stack_ffffffffffffff50,(char *)dest,0x102ee8);
  if (*local_18 == 4) {
    local_68 = (ulong)*(uint *)((long)puVar4 + local_54 + local_50);
  }
  else {
    local_68 = *(ulong *)((long)puVar4 + local_54 + local_50);
  }
  if (local_50 != local_68) {
    ssw_openerror(in_stack_ffffffffffffff50,(char *)dest);
  }
  if (local_18[0x3d] == 1) {
    puVar6 = (undefined8 *)((long)puVar4 + (ulong)local_54);
    *(undefined8 *)(local_18 + 1) = *puVar6;
    *(undefined4 *)((long)local_18 + 0xd) = *(undefined4 *)(puVar6 + 1);
    *(undefined1 *)((long)local_18 + 0x11) = *(undefined1 *)((long)puVar6 + 0xc);
    *(undefined8 *)((long)local_18 + 0x13) = *(undefined8 *)((long)puVar6 + 0xd);
    *(undefined8 *)((long)local_18 + 0x1b) = *(undefined8 *)((long)puVar6 + 0x15);
    *(undefined8 *)((long)local_18 + 0x23) = *(undefined8 *)((long)puVar6 + 0x1d);
    *(undefined4 *)((long)local_18 + 0x2b) = *(undefined4 *)((long)puVar6 + 0x25);
    *(undefined8 *)(local_18 + 0xc) = *(undefined8 *)((long)puVar6 + 0x29);
    *(undefined8 *)(local_18 + 0xe) = *(undefined8 *)((long)puVar6 + 0x31);
    *(undefined2 *)(local_18 + 0x10) = *(undefined2 *)((long)puVar6 + 0x39);
    memcpy(local_18 + 0x16,(void *)((long)puVar6 + 0x3b),(ulong)local_58);
    *(undefined1 *)(local_18 + 0x11) = 0;
  }
  else if (local_18[0x3d] == 2) {
    puVar6 = (undefined8 *)((long)puVar4 + (long)*local_18);
    *(undefined8 *)(local_18 + 1) = *puVar6;
    *(undefined4 *)((long)local_18 + 0xd) = *(undefined4 *)(puVar6 + 1);
    *(undefined1 *)((long)local_18 + 0x11) = *(undefined1 *)((long)puVar6 + 0xc);
    *(undefined8 *)((long)local_18 + 0x13) = *(undefined8 *)((long)puVar6 + 0xd);
    *(undefined8 *)((long)local_18 + 0x1b) = *(undefined8 *)((long)puVar6 + 0x15);
    *(undefined8 *)((long)local_18 + 0x23) = *(undefined8 *)((long)puVar6 + 0x1d);
    *(undefined4 *)((long)local_18 + 0x2b) = *(undefined4 *)((long)puVar6 + 0x25);
    *(undefined8 *)(local_18 + 0xc) = *(undefined8 *)((long)puVar6 + 0x29);
    *(undefined8 *)(local_18 + 0xe) = *(undefined8 *)((long)puVar6 + 0x31);
    *(undefined2 *)(local_18 + 0x10) = *(undefined2 *)((long)puVar6 + 0x39);
    *(undefined1 *)((long)local_18 + 0x42) = *(undefined1 *)((long)puVar6 + 0x3b);
    *(undefined8 *)(local_18 + 0x11) = *(undefined8 *)((long)puVar6 + 0x3c);
    *(undefined8 *)(local_18 + 0x13) = *(undefined8 *)((long)puVar6 + 0x44);
    *(undefined2 *)(local_18 + 0x15) = *(undefined2 *)((long)puVar6 + 0x4c);
    *(undefined1 *)((long)local_18 + 0x56) = *(undefined1 *)((long)puVar6 + 0x4e);
    memcpy(local_18 + 0x16,(void *)((long)puVar6 + 0x4f),0x50);
  }
  else {
    puVar6 = (undefined8 *)((long)puVar4 + (long)*local_18);
    *(undefined8 *)(local_18 + 1) = *puVar6;
    *(undefined4 *)((long)local_18 + 0xd) = *(undefined4 *)(puVar6 + 1);
    *(undefined1 *)((long)local_18 + 0x11) = *(undefined1 *)((long)puVar6 + 0xc);
    *(undefined8 *)((long)local_18 + 0x13) = *(undefined8 *)((long)puVar6 + 0xd);
    *(undefined8 *)(local_18 + 0xc) = *(undefined8 *)((long)puVar6 + 0x15);
    *(undefined8 *)(local_18 + 0xe) = *(undefined8 *)((long)puVar6 + 0x1d);
    *(undefined2 *)(local_18 + 0x10) = *(undefined2 *)((long)puVar6 + 0x25);
    *(undefined1 *)((long)local_18 + 0x42) = *(undefined1 *)((long)puVar6 + 0x27);
    *(undefined8 *)(local_18 + 0x11) = puVar6[5];
    *(undefined8 *)(local_18 + 0x13) = puVar6[6];
    *(undefined2 *)(local_18 + 0x15) = *(undefined2 *)(puVar6 + 7);
    *(undefined1 *)((long)local_18 + 0x56) = *(undefined1 *)((long)puVar6 + 0x3a);
    memcpy(local_18 + 0x16,(void *)((long)puVar6 + 0x3b),0x50);
  }
  ssw_strip((char **)in_stack_ffffffffffffff50);
  ssw_strip((char **)in_stack_ffffffffffffff50);
  ssw_strip((char **)in_stack_ffffffffffffff50);
  ssw_strip((char **)in_stack_ffffffffffffff50);
  ssw_strip((char **)in_stack_ffffffffffffff50);
  ssw_strip((char **)in_stack_ffffffffffffff50);
  __ptr = (void *)mcpl_basename(local_10);
  pFVar5 = (FILE *)ssw_stdout();
  fprintf(pFVar5,"ssw_open_file: Opened file \"%s\":\n",__ptr);
  free(__ptr);
  __s2 = "mcnp";
  if (local_18[0x3d] == 2) {
    __s2 = "mcnpx";
  }
  iVar3 = strcmp((char *)(local_18 + 1),__s2);
  if (iVar3 != 0) {
    pFVar5 = (FILE *)ssw_stdout();
    fprintf(pFVar5,"ssw_open_file WARNING: Unusual MCNP flavour detected (\"%s\").\n",local_18 + 1);
  }
  if (local_18[0x3d] == 1) {
    iVar3 = strcmp((char *)((long)local_18 + 0xd),"6");
    if ((iVar3 != 0) && (iVar3 = strcmp((char *)((long)local_18 + 0xd),"6.mpi"), iVar3 != 0)) {
      pFVar5 = (FILE *)ssw_stdout();
      fprintf(pFVar5,
              "ssw_open_file WARNING: Untested MCNP6 source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
              ,(long)local_18 + 0xd);
    }
  }
  else if (local_18[0x3d] == 2) {
    iVar3 = strcmp((char *)((long)local_18 + 0xd),"2.5.0");
    if ((((iVar3 != 0) && (iVar3 = strcmp((char *)((long)local_18 + 0xd),"2.6.0"), iVar3 != 0)) &&
        (iVar3 = strcmp((char *)((long)local_18 + 0xd),"2.7.0"), iVar3 != 0)) &&
       (iVar3 = strcmp((char *)((long)local_18 + 0xd),"26b"), iVar3 != 0)) {
      pFVar5 = (FILE *)ssw_stdout();
      fprintf(pFVar5,
              "ssw_open_file WARNING: Untested MCNPX source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
              ,(long)local_18 + 0xd);
    }
  }
  else if ((local_18[0x3d] == 3) && (iVar3 = strcmp((char *)((long)local_18 + 0xd),"5"), iVar3 != 0)
          ) {
    pFVar5 = (FILE *)ssw_stdout();
    fprintf(pFVar5,
            "ssw_open_file WARNING: Untested MCNP5 source version : \"%s\". (feedback appreciated at https://mctools.github.io/mcpl/contact/)\n"
            ,(long)local_18 + 0xd);
  }
  return (ssw_file_t)local_8;
}

Assistant:

ssw_file_t ssw_open_and_procrec0( const char * filename )
{
  ssw_fileinternal_t * f = (ssw_fileinternal_t*)calloc(1,sizeof(ssw_fileinternal_t));
  if (!f)
    ssw_error("memory allocation failure");
  f->filehandle.internal = NULL;

  ssw_file_t out;
  out.internal = f;

  //open file (can be gzipped if filename ends with .gz):
  f->filehandle = mcpl_generic_fopen( filename );

  //Prepare buffer. SSWREAD_STDBUFSIZE bytes should always be enough for the
  //first record (guaranteed by the checks below), but it might later grow on
  //demand inside ssw_loadrecord if needed.

  f->lbufmax = SSWREAD_STDBUFSIZE;
  char * buf = malloc(f->lbufmax);
  if (!buf)
    ssw_error("memory allocation failure");
  f->buf = buf;

  //Fortran data is usually written in "records" with an initial and final 32bit
  //or 64bit integer specifying the record byte-length. The tested file-types
  //begin in one of the following ways:
  //
  // 1) 4B[163|167] + KODS : MCNPX2.7.0 with 32bit reclen
  // 2) 8B[163|167] + KODS : MCNPX2.7.0 with 64bit reclen
  // 3) 16B +4B[143 or 191] + KODS : MCNP6 with 32bit reclen
  // 4) 24B +8B[143 or 191] + KODS : MCNP6 with 64bit reclen
  // 5) 4B[143]+KODS : MCNP5 with 32bit reclen.
  // 6) 8B[143]+KODS : MCNP5 with 64bit reclen.
  //
  //Where KODS is 8 bytes representing the "code name" as a string. For pure
  //MCNPX/MCNP6 this string contains "mcnpx" and "mcnp" respectively, but we
  //should allow for custom in-house versions with modified contents of KODS. We
  //do, however, require that the first character or KODS is an ASCII character
  //in the range 32-126 (i.e. non-extended ascii without control or null chars).
  //
  //Note that for option 3) and 4), the second record can have a length of
  //either 143 (MCNP 6.0) or 191 (MCNP 6.2), since the "aids" field increased in
  //size from 80 to 128 chars.
  //
  //Note that for option 3) and 4), the 16B / 24B are a fortran record with 8
  //bytes of data - usually (always?) the string "SF_00001".

  //Thus, we probe the first 36 bytes and search the patterns above:

  ssw_readbytes(f,buf,36);
  uint32_t first32 = *((uint32_t*)buf);
  uint64_t first64 = *((uint64_t*)buf);

  f->reclen = 0;
  f->mcnp_type = SSW_MCNP_NOTFOUND;
  uint64_t lenrec0 = 99999;
  unsigned rec0begin = 0;

  //First look for MCNP6:
  unsigned mcnp6_lenaids = 80;
  if ( first32==8 && *((uint32_t*)(buf+12))==8 && (*((uint32_t*)(buf+16))==143||*((uint32_t*)(buf+16))==191) && buf[20]>=32 && buf[20]<127) {
    //Looks like 3), an mcnp6 file with 32bit fortran records.
    f->mcnp_type = SSW_MCNP6;
    f->reclen = 4;
    lenrec0 = *((uint32_t*)(buf+16));
    rec0begin = 20;
    if (*((uint32_t*)(buf+16))==191)
      mcnp6_lenaids = 128;
  } else if ( first32==8 && *((uint64_t*)(buf+16))==8 && (*((uint64_t*)(buf+24))==143||*((uint64_t*)(buf+24))==191) && buf[32]>=32 && buf[32]<127) {
    //Looks like 4), an mcnp6 file with 64bit fortran records.
    f->mcnp_type = SSW_MCNP6;
    f->reclen = 8;
    lenrec0 = *((uint64_t*)(buf+24));
    rec0begin = 32;
    if (*((uint64_t*)(buf+24))==191)
      mcnp6_lenaids = 128;
  }

  //Next, look for MCNPX:
  if ( f->mcnp_type == SSW_MCNP_NOTFOUND ) {
    if ( (first32==163||first32==167) && ( buf[4]>=32 && buf[4]<127 ) ) {
      //Looks like 1), an mcnpx file with 32bit fortran records.
      f->mcnp_type = SSW_MCNPX;
      f->reclen = 4;
      lenrec0 = first32;
      rec0begin = 4;
    } else if ( (first64==163||first64==167) && ( buf[8]>=32 && buf[8]<127 ) ) {
      //Looks like 2), an mcnpx file with 64bit fortran records.
      f->mcnp_type = SSW_MCNPX;
      f->reclen = 8;
      lenrec0 = first64;
      rec0begin = 8;
    }
  }

  //Finally, look for MCNP5:
  if ( f->mcnp_type == SSW_MCNP_NOTFOUND ) {
    if ( first32==143 && ( buf[4]>=32 && buf[4]<127 ) ) {
      //Looks like 5), an mcnp5 file with 32bit fortran records.
      f->mcnp_type = SSW_MCNP5;
      f->reclen = 4;
      lenrec0 = first32;
      rec0begin = 4;
    } else if ( first64==143 && ( buf[8]>=32 && buf[8]<127 ) ) {
      //Looks like 6), an mcnp5 file with 64bit fortran records.
      f->mcnp_type = SSW_MCNP5;
      f->reclen = 8;
      lenrec0 = first64;
      rec0begin = 8;
    }
  }

  if ( f->mcnp_type == SSW_MCNP_NOTFOUND )
    ssw_openerror(f,"ssw_open_file error: File does not"
                  " look like a supported MCNP SSW file");

  assert(f->reclen && rec0begin && lenrec0 && lenrec0<99999 );

  if (f->reclen==8) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: 64bit Fortran records detected which is untested (feedback"
            " appreciated at https://mctools.github.io/mcpl/contact/).\n");
  }

  //Finish reading the first record:
  int missingrec0 = (int)(lenrec0 + rec0begin) - (int)36 + f->reclen;
  assert(missingrec0>0);
  ssw_readbytes(f,buf+36,missingrec0);

  //Check final marker:
  uint64_t lenrec0_b;
  if (f->reclen==4)
    lenrec0_b = *((uint32_t*)(buf+(rec0begin+lenrec0)));
  else
    lenrec0_b = *((uint64_t*)(buf+(rec0begin+lenrec0)));
  if (lenrec0!=lenrec0_b)
    ssw_openerror(f,"ssw_open_file error: Unexpected header contents\n");

  //decode first record, inspired by ssw.py:
  if (f->mcnp_type == SSW_MCNP6) {
    char * r = buf + rec0begin;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=28); r += n;
    memcpy(f->idtms,r, n=18); r += n;
    memcpy(f->aids,r, n=mcnp6_lenaids);
    f->probs[0]='\0';
  } else if (f->mcnp_type == SSW_MCNPX) {
    assert(lenrec0==163||lenrec0==167);
    char * r = buf + f->reclen;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=28); r += n;
    memcpy(f->idtms,r, n=19); r += n;
    memcpy(f->probs,r, n=19); r += n;
    memcpy(f->aids,r, n=80);
  } else {
    assert(f->mcnp_type == SSW_MCNP5);
    assert(lenrec0==143);
    char * r = buf + f->reclen;
    unsigned n;
    memcpy(f->kods,r, n=8); r += n;
    memcpy(f->vers,r, n=5); r += n;
    memcpy(f->lods,r, n=8); r += n;
    memcpy(f->idtms,r, n=19); r += n;
    memcpy(f->probs,r, n=19); r += n;
    memcpy(f->aids,r, n=80);
  }

  char * tmp;
  tmp = f->kods; ssw_strip(&tmp);
  tmp = f->vers; ssw_strip(&tmp);
  tmp = f->lods; ssw_strip(&tmp);
  tmp = f->idtms; ssw_strip(&tmp);
  tmp = f->probs; ssw_strip(&tmp);
  tmp = f->aids; ssw_strip(&tmp);
  char * bn = mcpl_basename(filename);
  fprintf(ssw_stdout(),"ssw_open_file: Opened file \"%s\":\n",bn);
  free(bn);
  const char * expected_kods = (f->mcnp_type == SSW_MCNPX?"mcnpx":"mcnp");
  if (strcmp(f->kods,expected_kods)!=0) {
    fprintf(ssw_stdout(),"ssw_open_file WARNING: Unusual MCNP flavour detected (\"%s\").\n",f->kods);
  }

  if (f->mcnp_type==SSW_MCNP6) {
    if ( strcmp(f->vers,"6")!=0 && strcmp(f->vers,"6.mpi")!=0 ) {
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNP6 source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
    }
  } else if (f->mcnp_type==SSW_MCNPX) {
    if ( strcmp(f->vers,"2.5.0")!=0 && strcmp(f->vers,"2.6.0")!=0
         && strcmp(f->vers,"2.7.0")!=0 && strcmp(f->vers,"26b")!=0 )
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNPX source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
  } else if (f->mcnp_type==SSW_MCNP5) {
    if ( strcmp(f->vers,"5")!=0 )
      fprintf(ssw_stdout(),"ssw_open_file WARNING: Untested MCNP5 source version : \"%s\". (feedback"
              " appreciated at https://mctools.github.io/mcpl/contact/)\n",f->vers);
  }

  return out;
}